

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_font * nk_font_atlas_add_from_file
                    (nk_font_atlas *atlas,char *file_path,float height,nk_font_config *config)

{
  FILE *__stream;
  size_t sVar1;
  void *__ptr;
  nk_font *pnVar2;
  long lVar3;
  nk_font_config *pnVar4;
  byte bVar5;
  nk_font_config cfg;
  nk_font_config local_88;
  
  bVar5 = 0;
  if (file_path == (char *)0x0 || atlas == (nk_font_atlas *)0x0) {
    return (nk_font *)0x0;
  }
  __stream = fopen(file_path,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar1 = ftell(__stream);
    if (-1 < (long)sVar1) {
      fseek(__stream,0,0);
      __ptr = (*(atlas->permanent).alloc)((atlas->permanent).userdata,(void *)0x0,sVar1);
      if (__ptr != (void *)0x0) {
        sVar1 = fread(__ptr,1,sVar1,__stream);
        fclose(__stream);
        if (config == (nk_font_config *)0x0) {
          local_88.merge_mode = '\0';
          local_88.pixel_snap = '\0';
          local_88.next = (nk_font_config *)0x0;
          local_88.padding[2] = '\0';
          local_88.oversample_v = '\x01';
          local_88.oversample_h = '\x03';
          local_88.padding[0] = '\0';
          local_88.padding[1] = '\0';
          local_88.coord_type = NK_COORD_UV;
          local_88.spacing.x = 0.0;
          local_88.spacing.y = 0.0;
          local_88.range = nk_font_default_glyph_ranges::ranges;
          local_88.font = (nk_baked_font *)0x0;
          local_88.fallback_glyph = 0x3f;
          local_88._68_8_ = 0;
          local_88._76_8_ = 0;
          local_88.p._4_4_ = 0;
        }
        else {
          pnVar4 = &local_88;
          for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
            pnVar4->next = config->next;
            config = (nk_font_config *)((long)config + (ulong)bVar5 * -0x10 + 8);
            pnVar4 = (nk_font_config *)((long)pnVar4 + ((ulong)bVar5 * -2 + 1) * 8);
          }
        }
        local_88.ttf_blob._0_3_ = SUB83(__ptr,0);
        local_88.ttf_blob._3_5_ = (undefined5)((ulong)__ptr >> 0x18);
        local_88.ttf_size._0_3_ = (undefined3)sVar1;
        local_88.ttf_size._3_5_ = (undefined5)(sVar1 >> 0x18);
        local_88.ttf_data_owned_by_atlas = '\x01';
        local_88.size = height;
        pnVar2 = nk_font_atlas_add(atlas,&local_88);
        return pnVar2;
      }
    }
    fclose(__stream);
  }
  return (nk_font *)0x0;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_from_file(struct nk_font_atlas *atlas, const char *file_path,
float height, const struct nk_font_config *config)
{
nk_size size;
char *memory;
struct nk_font_config cfg;

NK_ASSERT(atlas);
NK_ASSERT(atlas->temporary.alloc);
NK_ASSERT(atlas->temporary.free);
NK_ASSERT(atlas->permanent.alloc);
NK_ASSERT(atlas->permanent.free);

if (!atlas || !file_path) return 0;
memory = nk_file_load(file_path, &size, &atlas->permanent);
if (!memory) return 0;

cfg = (config) ? *config: nk_font_config(height);
cfg.ttf_blob = memory;
cfg.ttf_size = size;
cfg.size = height;
cfg.ttf_data_owned_by_atlas = 1;
return nk_font_atlas_add(atlas, &cfg);
}